

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

void BasicTests::readNetworkTest(char *networkSourceFile)

{
  Graph *pGVar1;
  Graph *this;
  allocator local_49;
  string local_48 [48];
  Graph *local_18;
  Graph *g;
  char *networkSourceFile_local;
  
  g = (Graph *)networkSourceFile;
  this = (Graph *)operator_new(0x88);
  Graph::Graph(this);
  pGVar1 = g;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,(char *)pGVar1,&local_49);
  Graph::input_read(this,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void BasicTests::readNetworkTest(char *networkSourceFile) {
    Graph *g = new Graph();
    g->input_read(networkSourceFile);
}